

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

uchar getUnOpcode(TokenType type)

{
  uchar uVar1;
  ostream *poVar2;
  string sStack_38;
  
  if (type == Ampersand) {
    uVar1 = 's';
  }
  else if (type == Plus) {
    uVar1 = 'q';
  }
  else if (type == Bang) {
    uVar1 = 'r';
  }
  else {
    if (type != Minus) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Token ");
      tokTypeToString_abi_cxx11_(&sStack_38,type);
      poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
      poVar2 = std::operator<<(poVar2," has no unary opcode translation.");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&sStack_38);
      exit(1);
    }
    uVar1 = 'p';
  }
  return uVar1;
}

Assistant:

inline constexpr unsigned char getUnOpcode(TokenType type) {
    switch (type) {
        case TokenType::Plus:
            return Opcode::POS;
        case TokenType::Minus:
            return Opcode::NEG;
        case TokenType::Bang:
            return Opcode::NOT;
        case TokenType::Ampersand:
            return Opcode::STRFY;
        default:
            // this should never happen
            std::cout << "Token " << tokTypeToString(type) << " has no unary opcode translation." << std::endl;
            exit(1);
    }
}